

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O0

csafestring_t * safe_create(char *str)

{
  csafestring_t *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RDI;
  size_t newLength;
  csafestring_t *obj;
  
  pcVar1 = (csafestring_t *)malloc(0x10);
  pcVar1->buffer_length = 8;
  if (in_RDI == (char *)0x0) {
    pcVar2 = (char *)calloc(1,pcVar1->buffer_length);
    pcVar1->data = pcVar2;
  }
  else {
    sVar3 = strlen(in_RDI);
    while (pcVar1->buffer_length < sVar3 + 1) {
      pcVar1->buffer_length = pcVar1->buffer_length << 1;
    }
    pcVar2 = (char *)malloc(pcVar1->buffer_length);
    pcVar1->data = pcVar2;
    strcpy(pcVar1->data,in_RDI);
  }
  return pcVar1;
}

Assistant:

csafestring_t *safe_create(char *str) {
	csafestring_t *obj = (csafestring_t *) malloc(sizeof(csafestring_t));

#ifdef EXPERIMENTAL_SIZING
	obj->sizing_size = safe_getInitSize();
	obj->buffer_length = 1<<obj->sizing_size;
	sizing_size += obj->sizing_size;
#else
	obj->buffer_length = INIT_LENGTH_CALC;
#endif
		
	if ( str == NULL ) {
		obj->data = (char *) calloc(sizeof(char), obj->buffer_length);
	} else {
		size_t newLength = strlen(str) + 1;

		while ( obj->buffer_length < newLength ) {
			obj->buffer_length <<= 1;
			
#ifdef EXPERIMENTAL_SIZING
			obj->sizing_size++;
			sizing_size++;
#endif
			
		}
		obj->data = (char *) malloc(obj->buffer_length);
		strcpy(obj->data, str);
	}
	
#ifdef EXPERIMENTAL_SIZING
	sizing_count++;
#endif
	
	return obj;
}